

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O0

void __thiscall
QByteArrayMatcher::QByteArrayMatcher(QByteArrayMatcher *this,QByteArrayMatcher *other)

{
  undefined8 *in_RDI;
  QByteArrayMatcher *in_stack_ffffffffffffffc8;
  QByteArrayMatcher *this_00;
  
  *in_RDI = 0;
  this_00 = (QByteArrayMatcher *)(in_RDI + 1);
  QByteArray::QByteArray((QByteArray *)0x4c14f1);
  operator=(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

QByteArrayMatcher::QByteArrayMatcher(const QByteArrayMatcher &other)
    : d(nullptr)
{
    operator=(other);
}